

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O1

int Nm_ManFindIdByNameTwoTypes(Nm_Man_t *p,char *pName,int Type1,int Type2)

{
  uint uVar1;
  Nm_Entry_t *pNVar2;
  
  pNVar2 = Nm_ManTableLookupName(p,pName,Type1);
  if (pNVar2 == (Nm_Entry_t *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = pNVar2->ObjId;
  }
  if (uVar1 == 0xffffffff) {
    pNVar2 = Nm_ManTableLookupName(p,pName,Type2);
    if (pNVar2 == (Nm_Entry_t *)0x0) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = pNVar2->ObjId;
    }
  }
  return uVar1;
}

Assistant:

int Nm_ManFindIdByNameTwoTypes( Nm_Man_t * p, char * pName, int Type1, int Type2 )
{
    int iNodeId;
    iNodeId = Nm_ManFindIdByName( p, pName, Type1 );
    if ( iNodeId == -1 )
        iNodeId = Nm_ManFindIdByName( p, pName, Type2 );
    if ( iNodeId == -1 )
        return -1;
    return iNodeId;
}